

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kalman_filter.cpp
# Opt level: O1

void __thiscall
KalmanFilter::Init(KalmanFilter *this,VectorXd *x_in,MatrixXd *P_in,MatrixXd *F_in,MatrixXd *H_in,
                  MatrixXd *R_in,MatrixXd *Q_in)

{
  VectorXd *this_00;
  ulong uVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  Index size;
  ulong uVar5;
  long lVar6;
  Matrix<double,__1,_1,_0,__1,_1> *other;
  
  this_00 = &this->x_;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (x_in->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
             ,1);
  uVar1 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  if (uVar1 == (x_in->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows) {
    uVar5 = uVar1 - ((long)uVar1 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < (long)uVar1) {
      lVar6 = 0;
      do {
        pdVar2 = (x_in->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + lVar6;
        dVar4 = pdVar2[1];
        pdVar3 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data + lVar6;
        *pdVar3 = *pdVar2;
        pdVar3[1] = dVar4;
        lVar6 = lVar6 + 2;
      } while (lVar6 < (long)uVar5);
    }
    if ((long)uVar5 < (long)uVar1) {
      pdVar2 = (x_in->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      pdVar3 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      do {
        pdVar3[uVar5] = pdVar2[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->P_,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)P_in);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->F_,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)F_in);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->H_,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)H_in);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->R_,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)R_in);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->Q_,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Q_in);
    return;
  }
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/basavarajnavalgund[P]tracking-with-Kalman-Filter/src/Eigen/src/Core/Assign.h"
                ,0x1f9,
                "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

void KalmanFilter::Init(VectorXd &x_in, MatrixXd &P_in, MatrixXd &F_in,
                        MatrixXd &H_in, MatrixXd &R_in, MatrixXd &Q_in) {
  x_ = x_in;
  P_ = P_in;
  F_ = F_in;
  H_ = H_in;
  R_ = R_in;
  Q_ = Q_in;

}